

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloomFilterTest.cpp
# Opt level: O2

string * generateStringWithLength_abi_cxx11_(string *__return_storage_ptr__,uint32_t length)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  random_device local_13b0;
  
  if (generateStringWithLength[abi:cxx11](unsigned_int)::rnd == '\0') {
    iVar1 = __cxa_guard_acquire(&generateStringWithLength[abi:cxx11](unsigned_int)::rnd);
    if (iVar1 != 0) {
      std::random_device::random_device(&local_13b0);
      uVar2 = std::random_device::_M_getval();
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&generateStringWithLength::rnd,(ulong)uVar2);
      std::random_device::~random_device(&local_13b0);
      __cxa_guard_release(&generateStringWithLength[abi:cxx11](unsigned_int)::rnd);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while (bVar3 = length != 0, length = length - 1, bVar3) {
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::operator()(&generateStringWithLength::rnd);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string generateStringWithLength(std::uint32_t length) {
    static std::mt19937 rnd(std::random_device{}());
    static const char charset[] =
        "0123456789"
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "abcdefghijklmnopqrstuvwxyz";
    std::string ret;
    for (std::uint32_t k = 0; k < length; ++k) {
        auto charIndex = static_cast<std::uint32_t>(rnd() % (sizeof(charset) - 1));
        ret += charset[charIndex];
    }
    return ret;
}